

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int mg_get_server_ports(mg_context *ctx,int size,mg_server_port *ports)

{
  ushort uVar1;
  short sVar2;
  socket *psVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  
  iVar6 = -1;
  if (0 < size) {
    memset(ports,0,(ulong)(uint)size << 5);
    if ((ctx != (mg_context *)0x0) && (psVar3 = ctx->listening_sockets, psVar3 != (socket *)0x0)) {
      uVar5 = 0;
      uVar4 = (ulong)ctx->num_listening_sockets;
      if ((int)ctx->num_listening_sockets < 1) {
        uVar4 = uVar5;
      }
      iVar6 = 0;
      do {
        if (uVar4 * 0x40 == uVar5) {
          return iVar6;
        }
        uVar1 = *(ushort *)((long)&psVar3->lsa + uVar5 + 2);
        ports[iVar6].port = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
        ports[iVar6].is_ssl = (uint)(&psVar3->is_ssl)[uVar5];
        ports[iVar6].is_redirect = (uint)(&psVar3->ssl_redir)[uVar5];
        sVar2 = *(short *)((long)&psVar3->lsa + uVar5);
        if (sVar2 == 2) {
          iVar7 = 1;
LAB_0011202a:
          ports[iVar6].protocol = iVar7;
          iVar6 = iVar6 + 1;
        }
        else if (sVar2 == 10) {
          iVar7 = 3;
          goto LAB_0011202a;
        }
        uVar5 = uVar5 + 0x40;
      } while ((ulong)(uint)size << 6 != uVar5);
    }
  }
  return iVar6;
}

Assistant:

CIVETWEB_API int
mg_get_server_ports(const struct mg_context *ctx,
                    int size,
                    struct mg_server_port *ports)
{
	int i, cnt = 0;

	if (size <= 0) {
		return -1;
	}
	memset(ports, 0, sizeof(*ports) * (size_t)size);
	if (!ctx) {
		return -1;
	}
	if (!ctx->listening_sockets) {
		return -1;
	}

	for (i = 0; (i < size) && (i < (int)ctx->num_listening_sockets); i++) {

		ports[cnt].port =
		    ntohs(USA_IN_PORT_UNSAFE(&(ctx->listening_sockets[i].lsa)));
		ports[cnt].is_ssl = ctx->listening_sockets[i].is_ssl;
		ports[cnt].is_redirect = ctx->listening_sockets[i].ssl_redir;

		if (ctx->listening_sockets[i].lsa.sa.sa_family == AF_INET) {
			/* IPv4 */
			ports[cnt].protocol = 1;
			cnt++;
		} else if (ctx->listening_sockets[i].lsa.sa.sa_family == AF_INET6) {
			/* IPv6 */
			ports[cnt].protocol = 3;
			cnt++;
		}
	}

	return cnt;
}